

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

int __thiscall despot::Parser::NumStates(Parser *this)

{
  pointer pSVar1;
  int iVar2;
  long lVar3;
  pointer *ppbVar4;
  double dVar5;
  
  dVar5 = LogNumStates(this);
  iVar2 = -1;
  if (dVar5 <= 30.0) {
    pSVar1 = (this->curr_state_vars_).
             super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar3 = (long)(this->curr_state_vars_).
                  super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pSVar1;
    if (lVar3 == 0) {
      iVar2 = 1;
    }
    else {
      lVar3 = (lVar3 >> 6) * -0x5555555555555555;
      lVar3 = lVar3 + (ulong)(lVar3 == 0);
      ppbVar4 = (pointer *)((long)&(pSVar1->super_NamedVar).super_Variable.values_ + 8);
      iVar2 = 1;
      do {
        iVar2 = iVar2 * (int)((ulong)((long)*ppbVar4 -
                                     (long)((_Vector_impl_data *)(ppbVar4 + -1))->_M_start) >> 5);
        ppbVar4 = ppbVar4 + 0x18;
        lVar3 = lVar3 + -1;
      } while (lVar3 != 0);
    }
  }
  return iVar2;
}

Assistant:

int Parser::NumStates() const {
	if (LogNumStates() > 30) {
		return -1;
	} else {
		int num_states = 1;
		for (int i = 0; i < curr_state_vars_.size(); i++) {
			num_states *= curr_state_vars_[i].Size();
		}

		return num_states;
	}
}